

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_insert(lws *wsi,lws *parent_wsi,uint sid)

{
  lws_log_cx *cx;
  char *pcVar1;
  uint sid_local;
  lws *parent_wsi_local;
  lws *wsi_local;
  
  cx = lwsl_wsi_get_cx(wsi);
  pcVar1 = lws_wsi_tag(parent_wsi);
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_wsi_mux_insert","par %s: assign sid %d (curr %d)",
              pcVar1,sid,(wsi->mux).my_sid);
  if (((wsi->mux).my_sid != 0) && ((wsi->mux).my_sid != sid)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi.c"
                  ,0x546,"void lws_wsi_mux_insert(struct lws *, struct lws *, unsigned int)");
  }
  (wsi->mux).my_sid = sid;
  (wsi->mux).parent_wsi = parent_wsi;
  wsi->role_ops = parent_wsi->role_ops;
  (wsi->mux).sibling_list = (parent_wsi->mux).child_list;
  (parent_wsi->mux).child_list = wsi;
  (parent_wsi->mux).child_count = (parent_wsi->mux).child_count + 1;
  return;
}

Assistant:

void
lws_wsi_mux_insert(struct lws *wsi, struct lws *parent_wsi, unsigned int sid)
{
	lwsl_wsi_info(wsi, "par %s: assign sid %d (curr %d)",
			lws_wsi_tag(parent_wsi), sid, wsi->mux.my_sid);

	if (wsi->mux.my_sid && wsi->mux.my_sid != (unsigned int)sid)
		assert(0);

	wsi->mux.my_sid = sid;
	wsi->mux.parent_wsi = parent_wsi;
	wsi->role_ops = parent_wsi->role_ops;

	/* new guy's sibling is whoever was the first child before */
	wsi->mux.sibling_list = parent_wsi->mux.child_list;

	/* first child is now the new guy */
	parent_wsi->mux.child_list = wsi;

	parent_wsi->mux.child_count++;
}